

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O1

void __thiscall
ft::deque<int,_ft::allocator<int>_>::dequeInit(deque<int,_ft::allocator<int>_> *this,size_type n)

{
  void *pvVar1;
  size_type sVar2;
  pointer pvVar3;
  map_pointer ppiVar4;
  void *pvVar5;
  pointer piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = n >> 6;
  uVar7 = 5;
  if (5 < uVar8) {
    uVar7 = uVar8;
  }
  this->m_chunks = uVar8 + 1;
  this->m_map_size = uVar7 + 3;
  ppiVar4 = (map_pointer)operator_new(uVar7 * 8 + 0x18);
  this->m_map = ppiVar4;
  uVar7 = this->m_map_size;
  if (uVar7 != 0) {
    sVar2 = this->m_chunks;
    pvVar1 = (void *)((long)ppiVar4 + (uVar7 - sVar2 & 0xfffffffffffffffe) * 4);
    lVar9 = 0;
    uVar8 = 0;
    do {
      pvVar5 = (void *)((long)this->m_map + lVar9);
      if ((void *)((long)pvVar1 + sVar2 * 8 + -8) < pvVar5 || pvVar5 < pvVar1) {
        piVar6 = (pointer)0x0;
      }
      else {
        piVar6 = (pointer)operator_new(0x100);
      }
      this->m_map[uVar8] = piVar6;
      uVar8 = uVar8 + 1;
      uVar7 = this->m_map_size;
      lVar9 = lVar9 + 8;
    } while (uVar8 < uVar7);
  }
  ppiVar4 = this->m_map;
  uVar7 = uVar7 * 4 - 4 & 0xfffffffffffffff8;
  (this->m_start).m_node = (map_pointer)((long)ppiVar4 + uVar7);
  pvVar3 = *(pointer *)((long)ppiVar4 + uVar7);
  (this->m_start).m_first = pvVar3;
  (this->m_start).m_last = pvVar3 + 0x40;
  (this->m_start).m_cur = pvVar3;
  (this->m_finish).m_node = (map_pointer)((long)ppiVar4 + uVar7);
  pvVar3 = *(pointer *)((long)ppiVar4 + uVar7);
  (this->m_finish).m_first = pvVar3;
  (this->m_finish).m_last = pvVar3 + 0x40;
  (this->m_finish).m_cur = pvVar3;
  return;
}

Assistant:

void dequeInit(size_type n) {
		chunk_allocator	chunk_alloc;

		this->m_chunks = (n / this->chunk_size()) + 1;
		this->m_map_size = ft::max<size_type>(8, this->m_chunks + 2);
		this->m_map = chunk_alloc.allocate(this->m_map_size);

		map_pointer	tmp_start = this->m_map + ((this->m_map_size - this->m_chunks) / 2);
		map_pointer	tmp_finish = tmp_start + this->m_chunks - 1;

		for (size_type i = 0; i < this->m_map_size; ++i) {
			pointer p = NULL;
			if (this->m_map + i >= tmp_start && this->m_map + i <= tmp_finish)
				p = this->m_alloc.allocate(this->chunk_size());
			chunk_alloc.construct(this->m_map + i, p);
		}

		this->m_start.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_start.m_cur = this->m_start.m_first;
		this->m_finish.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_finish.m_cur = this->m_finish.m_first;
	}